

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O1

Norm2AllModes * icu_63::Norm2AllModes::createInstance(Normalizer2Impl *impl,UErrorCode *errorCode)

{
  Norm2AllModes *pNVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pNVar1 = (Norm2AllModes *)UMemory::operator_new((UMemory *)0x58,(size_t)errorCode);
    if (pNVar1 == (Norm2AllModes *)0x0) {
      pNVar1 = (Norm2AllModes *)0x0;
    }
    else {
      pNVar1->impl = impl;
      (pNVar1->comp).super_Normalizer2WithImpl.impl = impl;
      (pNVar1->comp).super_Normalizer2WithImpl.super_Normalizer2.super_UObject._vptr_UObject =
           (_func_int **)&PTR__NoopNormalizer2_003ae0f0;
      (pNVar1->comp).onlyContiguous = '\0';
      (pNVar1->decomp).super_Normalizer2WithImpl.impl = impl;
      (pNVar1->decomp).super_Normalizer2WithImpl.super_Normalizer2.super_UObject._vptr_UObject =
           (_func_int **)&PTR__NoopNormalizer2_003ae018;
      (pNVar1->fcd).super_Normalizer2WithImpl.impl = impl;
      (pNVar1->fcd).super_Normalizer2WithImpl.super_Normalizer2.super_UObject._vptr_UObject =
           (_func_int **)&PTR__NoopNormalizer2_003ae1c8;
      (pNVar1->fcc).super_Normalizer2WithImpl.impl = impl;
      (pNVar1->fcc).super_Normalizer2WithImpl.super_Normalizer2.super_UObject._vptr_UObject =
           (_func_int **)&PTR__NoopNormalizer2_003ae0f0;
      (pNVar1->fcc).onlyContiguous = '\x01';
    }
    if (pNVar1 != (Norm2AllModes *)0x0) {
      return pNVar1;
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  if (impl != (Normalizer2Impl *)0x0) {
    (*(impl->super_UObject)._vptr_UObject[1])(impl);
  }
  return (Norm2AllModes *)0x0;
}

Assistant:

Norm2AllModes *
Norm2AllModes::createInstance(Normalizer2Impl *impl, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        delete impl;
        return NULL;
    }
    Norm2AllModes *allModes=new Norm2AllModes(impl);
    if(allModes==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        delete impl;
        return NULL;
    }
    return allModes;
}